

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SafeInt.hpp
# Opt level: O0

bool ModulusSimpleCaseHelper<unsigned_short,_unsigned_short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>,_1>
     ::ModulusSimpleCase(unsigned_short lhs,
                        SafeInt<unsigned_short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                        rhs,SafeInt<unsigned_short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                            *result)

{
  bool bVar1;
  unsigned_short uVar2;
  SafeInt<unsigned_short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
  *in_RDX;
  SafeInt<unsigned_short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
  in_SI;
  undefined2 in_DI;
  int in_stack_ffffffffffffffe0;
  SafeInt<unsigned_short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
  in_stack_ffffffffffffffe6;
  undefined2 uVar3;
  undefined2 in_stack_ffffffffffffffe8;
  SafeInt<unsigned_short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
  SVar4;
  
  SVar4.m_int = in_SI.m_int;
  bVar1 = ::operator!=(in_stack_ffffffffffffffe6,in_stack_ffffffffffffffe0);
  if (bVar1) {
    bVar1 = ModulusSignedCaseHelper<unsigned_short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>,_0>
            ::SignedCase(in_SI,in_RDX);
    if (!bVar1) {
      uVar3 = 0;
      uVar2 = ::SafeInt::operator_cast_to_unsigned_short
                        ((SafeInt<unsigned_short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                          *)(ulong)CONCAT24(in_DI,in_stack_ffffffffffffffe0));
      SafeInt<unsigned_short,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>
      ::operator=(in_RDX,(unsigned_short *)
                         CONCAT26(SVar4.m_int,
                                  CONCAT24(in_SI.m_int,
                                           CONCAT22((short)(CONCAT22(uVar3,in_DI) % (int)(uint)uVar2
                                                           ),in_stack_ffffffffffffffe8))));
    }
    return true;
  }
  safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>::SafeIntOnDivZero();
}

Assistant:

static bool ModulusSimpleCase( U lhs, SafeInt< T, E > rhs, SafeInt< T, E >& result ) SAFEINT_CPP_THROW
    {
        if( rhs != 0 )
        {
            if( ModulusSignedCaseHelper< T, E, std::numeric_limits< T >::is_signed >::SignedCase( rhs, result ) )
            return true;

            result = (T)( lhs % (T)rhs );
            return true;
        }

        E::SafeIntOnDivZero();
    }